

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuEmuD3D0::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuEmuD3D0 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdEmuD3D56TlvZ *pMVar1;
  MthdEmuD3D56TlvY *pMVar2;
  MthdEmuD3D56TlvX *pMVar3;
  MthdEmuD3D56TlvColor *pMVar4;
  MthdEmuEmuD3D0TlvFogTri *pMVar5;
  MthdEmuEmuD3D0Alpha *pMVar6;
  MthdEmuEmuD3D0Config *pMVar7;
  MthdEmuD3D56FogColor *pMVar8;
  MthdEmuEmuD3D0TexFilter *pMVar9;
  MthdEmuEmuD3D0TexFormat *pMVar10;
  MthdEmuD3D56TexOffset *pMVar11;
  MthdMissing *pMVar12;
  MthdCtxSurf *pMVar13;
  MthdCtxClip *pMVar14;
  MthdDmaGrobj *pMVar15;
  MthdDmaNotify *pMVar16;
  MthdPmTrigger *pMVar17;
  MthdNotify *pMVar18;
  SingleMthdTest *pSVar19;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar20;
  result_type rVar21;
  MthdEmuD3D56TlvW *this_01;
  MthdEmuD3D56TlvUv *pMVar22;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_490;
  allocator local_48f;
  allocator local_48e;
  allocator local_48d;
  allocator local_48c;
  allocator local_48b;
  allocator local_48a;
  allocator local_489;
  allocator local_488;
  allocator local_487;
  allocator local_486;
  allocator local_485;
  allocator local_484;
  allocator local_483;
  allocator local_482;
  allocator local_481;
  allocator local_480;
  allocator local_47f;
  allocator local_47e;
  allocator local_47d;
  allocator local_47c;
  allocator local_47b;
  allocator local_47a;
  allocator local_479;
  MthdEmuD3D56TlvZ *local_478;
  MthdEmuD3D56TlvY *local_470;
  MthdEmuD3D56TlvX *local_468;
  MthdEmuD3D56TlvColor *local_460;
  MthdEmuEmuD3D0TlvFogTri *local_458;
  MthdEmuEmuD3D0Alpha *local_450;
  MthdEmuEmuD3D0Config *local_448;
  MthdEmuD3D56FogColor *local_440;
  MthdEmuEmuD3D0TexFilter *local_438;
  MthdEmuEmuD3D0TexFormat *local_430;
  MthdEmuD3D56TexOffset *local_428;
  MthdMissing *local_420;
  MthdCtxSurf *local_418;
  MthdCtxSurf *local_410;
  MthdCtxClip *local_408;
  MthdDmaGrobj *local_400;
  MthdDmaNotify *local_3f8;
  MthdPmTrigger *local_3f0;
  MthdNotify *local_3e8;
  SingleMthdTest *local_3e0;
  MthdEmuD3D56TlvW *local_3d8;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  SingleMthdTest *local_e8;
  MthdNotify *local_e0;
  MthdPmTrigger *local_d8;
  MthdDmaNotify *local_d0;
  MthdDmaGrobj *local_c8;
  MthdCtxClip *local_c0;
  MthdCtxSurf *local_b8;
  MthdCtxSurf *local_b0;
  MthdMissing *local_a8;
  MthdEmuD3D56TexOffset *local_a0;
  MthdEmuEmuD3D0TexFormat *local_98;
  MthdEmuEmuD3D0TexFilter *local_90;
  MthdEmuD3D56FogColor *local_88;
  MthdEmuEmuD3D0Config *local_80;
  MthdEmuEmuD3D0Alpha *local_78;
  MthdEmuEmuD3D0TlvFogTri *local_70;
  MthdEmuD3D56TlvColor *local_68;
  MthdEmuD3D56TlvX *local_60;
  MthdEmuD3D56TlvY *local_58;
  MthdEmuD3D56TlvZ *local_50;
  MthdEmuD3D56TlvW *local_48;
  MthdEmuD3D56TlvUv *local_40;
  MthdEmuD3D56TlvUv *local_38;
  
  local_3d0 = __return_storage_ptr__;
  local_3e0 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_108,"nop",&local_479);
  pSVar19 = local_3e0;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_3e0,opt,(uint32_t)rVar21,&local_108,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_e8 = pSVar19;
  local_3e8 = (MthdNotify *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_128,"notify",&local_47a);
  pMVar18 = local_3e8;
  MthdNotify::SingleMthdTest
            (local_3e8,opt,(uint32_t)rVar21,&local_128,0,(this->super_Class).cls,0x104,1,4);
  local_e0 = pMVar18;
  local_3f0 = (MthdPmTrigger *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_148,"pm_trigger",&local_47b);
  pMVar17 = local_3f0;
  MthdPmTrigger::SingleMthdTest
            (local_3f0,opt,(uint32_t)rVar21,&local_148,-1,(this->super_Class).cls,0x140,1,4);
  local_d8 = pMVar17;
  local_3f8 = (MthdDmaNotify *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_168,"dma_notify",&local_47c);
  pMVar16 = local_3f8;
  MthdDmaNotify::SingleMthdTest
            (local_3f8,opt,(uint32_t)rVar21,&local_168,1,(this->super_Class).cls,0x180,1,4);
  local_d0 = pMVar16;
  local_400 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_188,"dma_tex",&local_47d);
  pMVar15 = local_400;
  MthdDmaGrobj::MthdDmaGrobj
            (local_400,opt,(uint32_t)rVar21,&local_188,2,(this->super_Class).cls,0x184,0,4);
  local_c8 = pMVar15;
  local_408 = (MthdCtxClip *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1a8,"ctx_clip",&local_47e);
  pMVar14 = local_408;
  MthdCtxClip::SingleMthdTest
            (local_408,opt,(uint32_t)rVar21,&local_1a8,3,(this->super_Class).cls,0x188,1,4);
  local_c0 = pMVar14;
  local_410 = (MthdCtxSurf *)operator_new(0x25958);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1c8,"ctx_color",&local_47f);
  pMVar13 = local_410;
  MthdCtxSurf::MthdCtxSurf
            (local_410,opt,(uint32_t)rVar21,&local_1c8,4,(this->super_Class).cls,0x18c,2);
  local_b8 = pMVar13;
  local_418 = (MthdCtxSurf *)operator_new(0x25958);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1e8,"ctx_zeta",&local_480);
  pMVar13 = local_418;
  MthdCtxSurf::MthdCtxSurf
            (local_418,opt,(uint32_t)rVar21,&local_1e8,5,(this->super_Class).cls,400,3);
  local_b0 = pMVar13;
  local_420 = (MthdMissing *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_208,"missing",&local_481);
  pMVar12 = local_420;
  MthdMissing::SingleMthdTest
            (local_420,opt,(uint32_t)rVar21,&local_208,-1,(this->super_Class).cls,0x200,4,4);
  local_a8 = pMVar12;
  local_428 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_228,"tex_offset",&local_482);
  pMVar11 = local_428;
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (local_428,opt,(uint32_t)rVar21,&local_228,6,(this->super_Class).cls,0x304,3);
  local_a0 = pMVar11;
  local_430 = (MthdEmuEmuD3D0TexFormat *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_248,"tex_format",&local_483);
  pMVar10 = local_430;
  MthdEmuEmuD3D0TexFormat::SingleMthdTest
            (local_430,opt,(uint32_t)rVar21,&local_248,7,(this->super_Class).cls,0x308,1,4);
  local_98 = pMVar10;
  local_438 = (MthdEmuEmuD3D0TexFilter *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_268,"tex_filter",&local_484);
  pMVar9 = local_438;
  MthdEmuEmuD3D0TexFilter::SingleMthdTest
            (local_438,opt,(uint32_t)rVar21,&local_268,8,(this->super_Class).cls,0x30c,1,4);
  local_90 = pMVar9;
  local_440 = (MthdEmuD3D56FogColor *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_288,"fog_color",&local_485);
  pMVar8 = local_440;
  MthdEmuD3D56FogColor::SingleMthdTest
            (local_440,opt,(uint32_t)rVar21,&local_288,9,(this->super_Class).cls,0x310,1,4);
  local_88 = pMVar8;
  local_448 = (MthdEmuEmuD3D0Config *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2a8,"config",&local_486);
  pMVar7 = local_448;
  MthdEmuEmuD3D0Config::SingleMthdTest
            (local_448,opt,(uint32_t)rVar21,&local_2a8,10,(this->super_Class).cls,0x314,1,4);
  local_80 = pMVar7;
  local_450 = (MthdEmuEmuD3D0Alpha *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2c8,"alpha",&local_487);
  pMVar6 = local_450;
  MthdEmuEmuD3D0Alpha::SingleMthdTest
            (local_450,opt,(uint32_t)rVar21,&local_2c8,0xb,(this->super_Class).cls,0x318,1,4);
  local_78 = pMVar6;
  local_458 = (MthdEmuEmuD3D0TlvFogTri *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2e8,"tlv_fog_tri",&local_488);
  pMVar5 = local_458;
  MthdEmuEmuD3D0TlvFogTri::SingleMthdTest
            (local_458,opt,(uint32_t)rVar21,&local_2e8,0xc,(this->super_Class).cls,0x1000,0x80,0x20)
  ;
  local_70 = pMVar5;
  local_460 = (MthdEmuD3D56TlvColor *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_308,"tlv_color",&local_489);
  pMVar4 = local_460;
  MthdEmuD3D56TlvColor::SingleMthdTest
            (local_460,opt,(uint32_t)rVar21,&local_308,0xd,(this->super_Class).cls,0x1004,0x80,0x20)
  ;
  local_68 = pMVar4;
  local_468 = (MthdEmuD3D56TlvX *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_328,"tlv_x",&local_48a);
  pMVar3 = local_468;
  MthdEmuD3D56TlvX::SingleMthdTest
            (local_468,opt,(uint32_t)rVar21,&local_328,0xe,(this->super_Class).cls,0x1008,0x80,0x20)
  ;
  local_60 = pMVar3;
  local_470 = (MthdEmuD3D56TlvY *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_348,"tlv_y",&local_48b);
  pMVar2 = local_470;
  MthdEmuD3D56TlvY::SingleMthdTest
            (local_470,opt,(uint32_t)rVar21,&local_348,0xf,(this->super_Class).cls,0x100c,0x80,0x20)
  ;
  local_58 = pMVar2;
  local_478 = (MthdEmuD3D56TlvZ *)operator_new(0x25950);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_368,"tlv_z",&local_48c);
  pMVar1 = local_478;
  MthdEmuD3D56TlvZ::SingleMthdTest
            (local_478,opt,(uint32_t)rVar21,&local_368,0x10,(this->super_Class).cls,0x1010,0x80,0x20
            );
  local_50 = pMVar1;
  this_01 = (MthdEmuD3D56TlvW *)operator_new(0x25950);
  local_3d8 = this_01;
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_388,"tlv_rhw",&local_48d);
  MthdEmuD3D56TlvW::SingleMthdTest
            (this_01,opt,(uint32_t)rVar21,&local_388,0x11,(this->super_Class).cls,0x1014,0x80,0x20);
  local_48 = this_01;
  pMVar22 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3a8,"tlv_u",&local_48e);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar22,opt,(uint32_t)rVar21,&local_3a8,0x12,(this->super_Class).cls,0x1018,0x80,0x20,0
             ,0,false);
  local_40 = pMVar22;
  pMVar22 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  rVar21 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3c8,"tlv_v",&local_48f);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar22,opt,(uint32_t)rVar21,&local_3c8,0x13,(this->super_Class).cls,0x101c,0x80,0x20,0
             ,1,true);
  pvVar20 = local_3d0;
  __l._M_len = 0x17;
  __l._M_array = &local_e8;
  local_38 = pMVar22;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_3d0,__l,&local_490);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return pvVar20;
}

Assistant:

std::vector<SingleMthdTest *> EmuEmuD3D0::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 3, cls, 0x188),
		new MthdCtxSurf(opt, rnd(), "ctx_color", 4, cls, 0x18c, 2),
		new MthdCtxSurf(opt, rnd(), "ctx_zeta", 5, cls, 0x190, 3),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 4),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_offset", 6, cls, 0x304, 3),
		new MthdEmuEmuD3D0TexFormat(opt, rnd(), "tex_format", 7, cls, 0x308),
		new MthdEmuEmuD3D0TexFilter(opt, rnd(), "tex_filter", 8, cls, 0x30c),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 9, cls, 0x310),
		new MthdEmuEmuD3D0Config(opt, rnd(), "config", 10, cls, 0x314),
		new MthdEmuEmuD3D0Alpha(opt, rnd(), "alpha", 11, cls, 0x318),
		new MthdEmuEmuD3D0TlvFogTri(opt, rnd(), "tlv_fog_tri", 12, cls, 0x1000, 0x80, 0x20),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 13, cls, 0x1004, 0x80, 0x20),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 14, cls, 0x1008, 0x80, 0x20),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 15, cls, 0x100c, 0x80, 0x20),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 16, cls, 0x1010, 0x80, 0x20),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 17, cls, 0x1014, 0x80, 0x20),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u", 18, cls, 0x1018, 0x80, 0x20, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v", 19, cls, 0x101c, 0x80, 0x20, 0, 1, true),
	};
}